

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManDivDoubleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  int iVar1;
  Vec_Wec_t *vCubes;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  char fUpdate_00;
  long lVar6;
  long lVar7;
  long lVar8;
  uint32_t iLit0;
  long lVar9;
  uint32_t uVar10;
  long local_40;
  
  if (-1 < iCube) {
    vCubes = pFxchMan->vCubes;
    if (iCube < vCubes->nSize) {
      pVVar2 = pFxchMan->vLitHashKeys;
      pVVar3 = vCubes->pArray;
      uVar10 = 0;
      if (1 < (long)pVVar3[(uint)iCube].nSize) {
        uVar10 = 0;
        lVar8 = 1;
        do {
          iVar1 = pVVar3[(uint)iCube].pArray[lVar8];
          if (((long)iVar1 < 0) || (pVVar2->nSize <= iVar1)) goto LAB_004c08d5;
          uVar10 = uVar10 + pVVar2->pArray[iVar1];
          lVar8 = lVar8 + 1;
        } while (pVVar3[(uint)iCube].nSize != lVar8);
      }
      fUpdate_00 = (char)fUpdate;
      if (fAdd == 0) {
        Fxch_SCHashTableRemove(pFxchMan->pSCHashTable,vCubes,uVar10,iCube,0,0,fUpdate_00);
      }
      else {
        Fxch_SCHashTableInsert(pFxchMan->pSCHashTable,vCubes,uVar10,iCube,0,0,fUpdate_00);
      }
      if (1 < pVVar3[(uint)iCube].nSize) {
        local_40 = 2;
        lVar8 = 1;
        do {
          iVar1 = pVVar3[(uint)iCube].pArray[lVar8];
          lVar6 = (long)iVar1;
          if ((lVar6 < 0) || (pVVar2->nSize <= iVar1)) {
LAB_004c08d5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = uVar10 - pVVar2->pArray[lVar6];
          iLit0 = (uint32_t)lVar8;
          if (fAdd == 0) {
            iVar4 = Fxch_SCHashTableRemove
                              (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar10,iCube,iLit0,0,
                               fUpdate_00);
          }
          else {
            iVar4 = Fxch_SCHashTableInsert
                              (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar10,iCube,iLit0,0,
                               fUpdate_00);
          }
          pFxchMan->nPairsD = pFxchMan->nPairsD + iVar4;
          if ((2 < pVVar3[(uint)iCube].nSize) &&
             (lVar9 = local_40, lVar8 + 1 < (long)pVVar3[(uint)iCube].nSize)) {
            do {
              iVar4 = pVVar3[(uint)iCube].pArray[lVar9];
              lVar7 = (long)iVar4;
              if ((lVar7 < 0) || (pVVar2->nSize <= iVar4)) goto LAB_004c08d5;
              uVar10 = uVar10 - pVVar2->pArray[lVar7];
              if (fAdd == 0) {
                iVar5 = Fxch_SCHashTableRemove
                                  (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar10,iCube,iLit0,
                                   (uint32_t)lVar9,fUpdate_00);
              }
              else {
                iVar5 = Fxch_SCHashTableInsert
                                  (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar10,iCube,iLit0,
                                   (uint32_t)lVar9,fUpdate_00);
              }
              pFxchMan->nPairsD = pFxchMan->nPairsD + iVar5;
              if (pVVar2->nSize <= iVar4) goto LAB_004c08d5;
              uVar10 = uVar10 + pVVar2->pArray[lVar7];
              lVar9 = lVar9 + 1;
            } while ((int)lVar9 < pVVar3[(uint)iCube].nSize);
          }
          if (pVVar2->nSize <= iVar1) goto LAB_004c08d5;
          uVar10 = uVar10 + pVVar2->pArray[lVar6];
          lVar8 = lVar8 + 1;
          local_40 = local_40 + 1;
        } while (lVar8 < pVVar3[(uint)iCube].nSize);
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

static inline void Fxch_ManDivDoubleCube( Fxch_Man_t* pFxchMan,
                                          int iCube,
                                          int fAdd,
                                          int fUpdate )
{
    Vec_Int_t* vLitHashKeys = pFxchMan->vLitHashKeys,
             * vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int SubCubeID = 0,
        iLit0,
        Lit0;

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );

    Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                         iCube, 0, 0,
                         (char)fAdd, (char)fUpdate );

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
    {
        /* 1 Lit remove */
        SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit0 );

        pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                  iCube, iLit0, 0,
                                                  (char)fAdd, (char)fUpdate );

        if ( Vec_IntSize( vCube ) >= 3 )
        {
            int Lit1,
                iLit1;

            Vec_IntForEachEntryStart( vCube, Lit1, iLit1, iLit0 + 1)
            {
                /* 2 Lit remove */
                SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit1 );

                pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                          iCube, iLit0, iLit1,
                                                          (char)fAdd, (char)fUpdate );

                SubCubeID += Vec_IntEntry( vLitHashKeys, Lit1 );
            }
        }

        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );
    }
}